

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O3

void __thiscall NPC::Die(NPC *this,bool show)

{
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *this_00;
  long lVar1;
  Character *this_01;
  Map *pMVar2;
  bool bVar3;
  _List_iterator<NPC_*> __first;
  __normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_> __dest;
  NPC **ppNVar4;
  size_t __n;
  _List_iterator<NPC_*> __last;
  list<Character_*,_std::allocator<Character_*>_> *plVar5;
  _List_node_base *p_Var6;
  NPC **ppNVar7;
  double dVar8;
  PacketBuilder builder;
  PacketBuilder local_60;
  
  if (this->alive == true) {
    this->alive = false;
    this->parent = (NPC *)0x0;
    dVar8 = Timer::GetTime();
    this->dead_since = (double)(int)dVar8;
    this_00 = &this->damagelist;
    p_Var6 = (this->damagelist).
             super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var6 != (_List_node_base *)this_00) {
      do {
        lVar1 = (long)(p_Var6[1]._M_next)->_M_next;
        __last._M_node = (_List_node_base *)(lVar1 + 0x378);
        local_60._0_8_ = this;
        __first = std::
                  __remove_if<std::_List_iterator<NPC*>,__gnu_cxx::__ops::_Iter_equals_val<NPC*const>>
                            (*(_List_node_base **)(lVar1 + 0x378),__last,
                             (_Iter_equals_val<NPC_*const>)&local_60);
        std::__cxx11::list<NPC_*,_std::allocator<NPC_*>_>::erase
                  ((list<NPC_*,_std::allocator<NPC_*>_> *)__last._M_node,
                   (const_iterator)__first._M_node,(p_Var6[1]._M_next)->_M_next + 0x378);
        p_Var6 = p_Var6->_M_next;
      } while (p_Var6 != (_List_node_base *)this_00);
    }
    std::__cxx11::
    _List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
    ::_M_clear(&this_00->
                super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
              );
    (this->damagelist).
    super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
    (this->damagelist).
    super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
    (this->damagelist).
    super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
    ._M_impl._M_node._M_size = 0;
    this->totaldamage = 0;
    if (show) {
      PacketBuilder::PacketBuilder(&local_60,PACKET_NPC,PACKET_SPEC,0x12);
      PacketBuilder::AddShort(&local_60,0);
      PacketBuilder::AddChar(&local_60,0);
      PacketBuilder::AddShort(&local_60,(uint)this->index);
      PacketBuilder::AddShort(&local_60,0);
      PacketBuilder::AddShort(&local_60,0);
      PacketBuilder::AddChar(&local_60,(uint)this->x);
      PacketBuilder::AddChar(&local_60,(uint)this->y);
      PacketBuilder::AddInt(&local_60,0);
      PacketBuilder::AddThree(&local_60,this->hp);
      p_Var6 = (this->map->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      plVar5 = &this->map->characters;
      if (p_Var6 != (_List_node_base *)plVar5) {
        do {
          this_01 = (Character *)p_Var6[1]._M_next;
          bVar3 = Character::InRange(this_01,this);
          if (bVar3) {
            Character::Send(this_01,&local_60);
          }
          p_Var6 = p_Var6->_M_next;
        } while (p_Var6 != (_List_node_base *)plVar5);
      }
      PacketBuilder::~PacketBuilder(&local_60);
    }
    if (this->temporary == true) {
      pMVar2 = this->map;
      local_60._0_8_ = this;
      __dest = std::
               __remove_if<__gnu_cxx::__normal_iterator<NPC**,std::vector<NPC*,std::allocator<NPC*>>>,__gnu_cxx::__ops::_Iter_equals_val<NPC*const>>
                         ((__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>)
                          (pMVar2->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>)
                          (pMVar2->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                          super__Vector_impl_data._M_finish,(_Iter_equals_val<NPC_*const>)&local_60)
      ;
      ppNVar7 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (__dest._M_current != ppNVar7) {
        __n = (long)(pMVar2->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppNVar7;
        ppNVar4 = ppNVar7;
        if (__n != 0) {
          memmove(__dest._M_current,ppNVar7,__n);
          ppNVar4 = (pMVar2->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        ppNVar7 = __dest._M_current + ((long)ppNVar4 - (long)ppNVar7);
        if (ppNVar4 != ppNVar7) {
          (pMVar2->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
          super__Vector_impl_data._M_finish = ppNVar7;
        }
      }
      ~NPC(this);
      operator_delete(this,0x70);
    }
  }
  return;
}

Assistant:

void NPC::Die(bool show)
{
	if (!this->alive)
		return;

	this->alive = false;
	this->parent = 0;
	this->dead_since = int(Timer::GetTime());

	UTIL_FOREACH_CREF(this->damagelist, opponent)
	{
		opponent->attacker->unregister_npc.erase(
			std::remove(UTIL_RANGE(opponent->attacker->unregister_npc), this),
			opponent->attacker->unregister_npc.end()
		);
	}

	this->damagelist.clear();
	this->totaldamage = 0;

	if (show)
	{
		PacketBuilder builder(PACKET_NPC, PACKET_SPEC, 18);
		builder.AddShort(0); // killer pid
		builder.AddChar(0); // killer direction
		builder.AddShort(this->index);
		builder.AddShort(0); // dropped item uid
		builder.AddShort(0); // dropped item id
		builder.AddChar(this->x);
		builder.AddChar(this->y);
		builder.AddInt(0); // dropped item amount
		builder.AddThree(this->hp); // damage

		UTIL_FOREACH(this->map->characters, character)
		{
			if (character->InRange(this))
			{
				character->Send(builder);
			}
		}
	}

	if (this->temporary)
	{
		this->map->npcs.erase(
			std::remove(this->map->npcs.begin(), this->map->npcs.end(), this),
			this->map->npcs.end()
		);

		delete this;
	}
}